

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 UVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  
  pBVar2 = (ms->window).base;
  pUVar3 = ms->hashTable;
  uVar18 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  uVar25 = ms->nextToUpdate;
  uVar16 = (ulong)uVar25;
  uVar21 = (uint)((long)ip - (long)pBVar2);
  cVar5 = (char)(ms->cParams).hashLog;
  bVar9 = cVar5 - 2;
  lVar15 = 1L << (bVar9 & 0x3f);
  uVar24 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  uVar12 = 3 << (bVar9 & 0x1f);
  uVar20 = uVar21 - uVar12;
  uVar11 = (ulong)uVar20;
  if (uVar21 < uVar12 || uVar20 == 0) {
    uVar11 = uVar16;
  }
  uVar12 = (uint)uVar11;
  pUVar4 = ms->chainTable;
  uVar10 = (long)ip - (long)pBVar2 & 0xffffffff;
  for (; uVar16 < uVar10; uVar16 = uVar16 + 1) {
    switch((ms->cParams).minMatch) {
    case 5:
      uVar8 = *(long *)(pBVar2 + uVar16) * -0x30e4432345000000;
      break;
    case 6:
      lVar7 = -0x30e4432340650000;
      goto LAB_004edcb2;
    case 7:
      lVar7 = -0x30e44323405a9d00;
LAB_004edcb2:
      uVar8 = lVar7 * *(long *)(pBVar2 + uVar16);
      break;
    case 8:
      uVar8 = *(long *)(pBVar2 + uVar16) * -0x30e44323485a9b9d;
      break;
    default:
      uVar20 = (uint)(*(int *)(pBVar2 + uVar16) * -0x61c8864f) >> (0x22U - cVar5 & 0x1f);
      goto LAB_004edcc4;
    }
    uVar20 = (uint)(uVar8 >> (0x42U - cVar5 & 0x3f));
LAB_004edcc4:
    if (uVar11 <= uVar16) {
      pUVar3[lVar15 + (ulong)((U32)uVar16 - uVar12)] = pUVar3[uVar20];
    }
    pUVar3[uVar20] = (U32)uVar16;
  }
  if (uVar18 < uVar21) {
    uVar25 = uVar21 - uVar18;
  }
  uVar18 = 0xff;
  if (uVar24 < 0xff) {
    uVar18 = uVar24;
  }
  uVar20 = 1 << (bVar9 & 0x1f);
  uVar16 = (ulong)uVar20;
  uVar24 = 0;
  for (uVar11 = 0; uVar11 != uVar16; uVar11 = uVar11 + 1) {
    uVar6 = 0;
    puVar17 = pUVar3 + uVar11;
    for (uVar19 = 0; (uVar23 = *puVar17, uVar12 <= uVar23 && (uVar19 < 3)); uVar19 = uVar19 + 1) {
      uVar6 = uVar6 + (uVar23 < uVar25);
      puVar17 = pUVar3 + lVar15 + (ulong)(uVar23 - uVar12);
    }
    uVar14 = 0;
    uVar22 = uVar24;
    if (uVar19 == 3) {
      uVar13 = 0;
      uVar19 = uVar24;
      while( true ) {
        uVar14 = uVar18;
        uVar22 = uVar19;
        if ((uVar18 == uVar13) ||
           ((uVar22 = uVar24 + uVar13, uVar23 < uVar25 &&
            ((uVar14 = uVar13, uVar23 == 0 || (uVar6 = uVar6 + 1, 3 < uVar6)))))) goto LAB_004edda1;
        uVar19 = uVar19 + 1;
        pUVar4[uVar22] = uVar23;
        if (uVar23 < uVar12) break;
        uVar23 = pUVar3[lVar15 + (ulong)(uVar23 - uVar12)];
        uVar13 = uVar13 + 1;
      }
      uVar14 = uVar13 + 1;
      uVar22 = uVar19;
    }
LAB_004edda1:
    uVar24 = uVar22;
    uVar6 = uVar24 * 0x100 + uVar14 * -0xff;
    if (uVar14 == 0) {
      uVar6 = 0;
    }
    pUVar3[uVar11] = uVar6;
  }
  uVar20 = uVar20 * 4;
  while( true ) {
    uVar20 = uVar20 - 4;
    iVar26 = (int)uVar16;
    uVar25 = iVar26 - 1;
    uVar16 = (ulong)uVar25;
    if (iVar26 == 0) break;
    UVar1 = pUVar3[uVar16];
    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
      pUVar3[(ulong)uVar20 + lVar15] = 0;
    }
    pUVar3[(ulong)(uVar25 * 4) + 3] = UVar1;
  }
  uVar11 = (ulong)ms->nextToUpdate;
  do {
    if (uVar10 <= uVar11) {
      ms->nextToUpdate = uVar21;
      return;
    }
    switch((ms->cParams).minMatch) {
    case 5:
      uVar16 = *(long *)(pBVar2 + uVar11) * -0x30e4432345000000;
      break;
    case 6:
      uVar16 = *(long *)(pBVar2 + uVar11) * -0x30e4432340650000;
      break;
    case 7:
      uVar16 = *(long *)(pBVar2 + uVar11) * -0x30e44323405a9d00;
      break;
    case 8:
      uVar16 = *(long *)(pBVar2 + uVar11) * -0x30e44323485a9b9d;
      break;
    default:
      uVar25 = (uint)(*(int *)(pBVar2 + uVar11) * -0x61c8864f) >> (0x22U - cVar5 & 0x1f);
      goto LAB_004edea6;
    }
    uVar25 = (uint)(uVar16 >> (0x42U - cVar5 & 0x3f));
LAB_004edea6:
    for (lVar15 = 0; lVar15 != -2; lVar15 = lVar15 + -1) {
      pUVar3[(ulong)(uVar25 & 0x3fffffff) * 4 + lVar15 + 2] = pUVar3[uVar25 * 4 + 1 + (int)lVar15];
    }
    pUVar3[uVar25 * 4] = (U32)uVar11;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = ((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}